

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aierror.cpp
# Opt level: O2

string * __thiscall
ai::stringFromErrno_abi_cxx11_(string *__return_storage_ptr__,ai *this,int error_code)

{
  char *pcVar1;
  allocator<char> local_79;
  char buf_err [100];
  
  buf_err[0x50] = '\0';
  buf_err[0x51] = '\0';
  buf_err[0x52] = '\0';
  buf_err[0x53] = '\0';
  buf_err[0x54] = '\0';
  buf_err[0x55] = '\0';
  buf_err[0x56] = '\0';
  buf_err[0x57] = '\0';
  buf_err[0x58] = '\0';
  buf_err[0x59] = '\0';
  buf_err[0x5a] = '\0';
  buf_err[0x5b] = '\0';
  buf_err[0x5c] = '\0';
  buf_err[0x5d] = '\0';
  buf_err[0x5e] = '\0';
  buf_err[0x5f] = '\0';
  buf_err[0x40] = '\0';
  buf_err[0x41] = '\0';
  buf_err[0x42] = '\0';
  buf_err[0x43] = '\0';
  buf_err[0x44] = '\0';
  buf_err[0x45] = '\0';
  buf_err[0x46] = '\0';
  buf_err[0x47] = '\0';
  buf_err[0x48] = '\0';
  buf_err[0x49] = '\0';
  buf_err[0x4a] = '\0';
  buf_err[0x4b] = '\0';
  buf_err[0x4c] = '\0';
  buf_err[0x4d] = '\0';
  buf_err[0x4e] = '\0';
  buf_err[0x4f] = '\0';
  buf_err[0x30] = '\0';
  buf_err[0x31] = '\0';
  buf_err[0x32] = '\0';
  buf_err[0x33] = '\0';
  buf_err[0x34] = '\0';
  buf_err[0x35] = '\0';
  buf_err[0x36] = '\0';
  buf_err[0x37] = '\0';
  buf_err[0x38] = '\0';
  buf_err[0x39] = '\0';
  buf_err[0x3a] = '\0';
  buf_err[0x3b] = '\0';
  buf_err[0x3c] = '\0';
  buf_err[0x3d] = '\0';
  buf_err[0x3e] = '\0';
  buf_err[0x3f] = '\0';
  buf_err[0x20] = '\0';
  buf_err[0x21] = '\0';
  buf_err[0x22] = '\0';
  buf_err[0x23] = '\0';
  buf_err[0x24] = '\0';
  buf_err[0x25] = '\0';
  buf_err[0x26] = '\0';
  buf_err[0x27] = '\0';
  buf_err[0x28] = '\0';
  buf_err[0x29] = '\0';
  buf_err[0x2a] = '\0';
  buf_err[0x2b] = '\0';
  buf_err[0x2c] = '\0';
  buf_err[0x2d] = '\0';
  buf_err[0x2e] = '\0';
  buf_err[0x2f] = '\0';
  buf_err[0x10] = '\0';
  buf_err[0x11] = '\0';
  buf_err[0x12] = '\0';
  buf_err[0x13] = '\0';
  buf_err[0x14] = '\0';
  buf_err[0x15] = '\0';
  buf_err[0x16] = '\0';
  buf_err[0x17] = '\0';
  buf_err[0x18] = '\0';
  buf_err[0x19] = '\0';
  buf_err[0x1a] = '\0';
  buf_err[0x1b] = '\0';
  buf_err[0x1c] = '\0';
  buf_err[0x1d] = '\0';
  buf_err[0x1e] = '\0';
  buf_err[0x1f] = '\0';
  buf_err[0] = '\0';
  buf_err[1] = '\0';
  buf_err[2] = '\0';
  buf_err[3] = '\0';
  buf_err[4] = '\0';
  buf_err[5] = '\0';
  buf_err[6] = '\0';
  buf_err[7] = '\0';
  buf_err[8] = '\0';
  buf_err[9] = '\0';
  buf_err[10] = '\0';
  buf_err[0xb] = '\0';
  buf_err[0xc] = '\0';
  buf_err[0xd] = '\0';
  buf_err[0xe] = '\0';
  buf_err[0xf] = '\0';
  buf_err[0x60] = '\0';
  buf_err[0x61] = '\0';
  buf_err[0x62] = '\0';
  buf_err[99] = '\0';
  pcVar1 = strerror_r((int)this,buf_err,100);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = buf_err;
  }
  else {
    pcVar1 = "!formatting errno failed!";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pcVar1,&local_79);
  return __return_storage_ptr__;
}

Assistant:

std::string stringFromErrno(const int error_code)
    {
        char buf_err[100] = {0};
        const auto buf_len = std::extent<decltype(buf_err)>::value;
#ifdef _MSC_VER
        if (!strerror_s(buf_err, buf_len, error_code))
        {
            return buf_err;
        }
#else
        if (!strerror_r(error_code, buf_err, buf_len))
        {
            return buf_err;
        }
#endif        
        return "!formatting errno failed!";
    }